

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t
ctrl_set_target_seq_level_idx(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  long lVar1;
  uint uVar2;
  av1_extracfg *extra_cfg_00;
  aom_codec_alg_priv_t_conflict *in_RSI;
  undefined8 *in_RDI;
  char *err_string;
  int operating_point_idx;
  int level;
  int val;
  av1_extracfg extra_cfg;
  undefined1 local_270 [484];
  undefined1 auStack_8c [116];
  aom_codec_alg_priv_t_conflict *local_18;
  undefined8 *local_10;
  aom_codec_err_t local_4;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  memcpy(local_270,in_RDI + 0x8b,600);
  uVar2 = *(uint *)&(local_18->base).err_detail;
  if (uVar2 < 0x29) {
    extra_cfg_00 = (av1_extracfg *)
                   ((long)(int)uVar2 + (long)(local_18->base).enc.cx_data_dst_buf.buf);
    *(uint *)&(local_18->base).err_detail = uVar2 + 8;
  }
  else {
    extra_cfg_00 = (av1_extracfg *)(local_18->base).init_flags;
    (local_18->base).init_flags = (aom_codec_flags_t)&extra_cfg_00->enable_auto_bwd_ref;
  }
  uVar2 = extra_cfg_00->cpu_used / 100;
  if (((int)uVar2 < 0) || (0x1f < (int)uVar2)) {
    lVar1 = local_10[0x16a];
    snprintf((char *)(lVar1 + 0xc768),200,"Invalid operating point index: %d",(ulong)uVar2);
    *local_10 = (char *)(lVar1 + 0xc768);
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    auStack_8c[(int)uVar2] = (char)(extra_cfg_00->cpu_used % 100);
    local_4 = update_extra_cfg(local_18,extra_cfg_00);
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_set_target_seq_level_idx(aom_codec_alg_priv_t *ctx,
                                                     va_list args) {
  struct av1_extracfg extra_cfg = ctx->extra_cfg;
  const int val = CAST(AV1E_SET_TARGET_SEQ_LEVEL_IDX, args);
  const int level = val % 100;
  const int operating_point_idx = val / 100;
  if (operating_point_idx < 0 ||
      operating_point_idx >= MAX_NUM_OPERATING_POINTS) {
    char *const err_string = ctx->ppi->error.detail;
    snprintf(err_string, ARG_ERR_MSG_MAX_LEN,
             "Invalid operating point index: %d", operating_point_idx);
    ctx->base.err_detail = err_string;
    return AOM_CODEC_INVALID_PARAM;
  }
  extra_cfg.target_seq_level_idx[operating_point_idx] = (AV1_LEVEL)level;
  return update_extra_cfg(ctx, &extra_cfg);
}